

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 start,UChar32 end)

{
  UChar32 range [3];
  int local_14;
  int local_10;
  undefined4 local_c;
  
  if (0x10fffe < start) {
    start = 0x10ffff;
  }
  local_10 = 0x10ffff;
  if (end < 0x10ffff) {
    local_10 = end;
  }
  if (local_10 < 1) {
    local_10 = 0;
  }
  if (local_10 < start) {
    clear(this);
  }
  else {
    if (start < 1) {
      start = 0;
    }
    local_10 = local_10 + 1;
    local_c = 0x110000;
    local_14 = start;
    retain(this,&local_14,2,'\0');
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retain(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 0);
    } else {
        clear();
    }
    return *this;
}